

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O3

int64_t __thiscall
aeron::DriverProxy::removeRcvDestination
          (DriverProxy *this,int64_t subscriptionRegistrationId,string *channel)

{
  long *plVar1;
  int64_t correlationId;
  long local_38;
  int64_t local_30;
  anon_class_32_4_a7d1d41a local_28;
  
  local_28.correlationId = &local_38;
  local_28.subscriptionRegistrationId = &local_30;
  LOCK();
  plVar1 = (long *)(this->m_toDriverCommandBuffer->m_buffer->m_buffer +
                   this->m_toDriverCommandBuffer->m_correlationIdCounterIndex);
  local_38 = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  local_30 = subscriptionRegistrationId;
  local_28.this = this;
  local_28.channel = channel;
  writeCommandToDriver<aeron::DriverProxy::removeRcvDestination(long,std::__cxx11::string_const&)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (this,&local_28);
  return local_38;
}

Assistant:

std::int64_t removeRcvDestination(std::int64_t subscriptionRegistrationId, const std::string& channel)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            DestinationMessageFlyweight removeMessage(buffer, 0);

            removeMessage.clientId(m_clientId);
            removeMessage.registrationId(subscriptionRegistrationId);
            removeMessage.correlationId(correlationId);
            removeMessage.channel(channel);

            length = removeMessage.length();

            return ControlProtocolEvents::REMOVE_RCV_DESTINATION;
        });

        return correlationId;
    }